

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# groupnorm.cpp
# Opt level: O0

int __thiscall ncnn::GroupNorm::load_model(GroupNorm *this,ModelBin *mb)

{
  bool bVar1;
  long *in_RSI;
  long in_RDI;
  Mat *in_stack_ffffffffffffff30;
  Mat *m;
  Mat *this_00;
  Mat local_b8;
  Mat local_60;
  long *local_18;
  int local_4;
  
  if (*(int *)(in_RDI + 0xdc) == 0) {
    local_4 = 0;
  }
  else {
    this_00 = &local_60;
    local_18 = in_RSI;
    (**(code **)(*in_RSI + 0x10))(this_00,in_RSI,*(undefined4 *)(in_RDI + 0xd4),1);
    ncnn::Mat::operator=(this_00,in_stack_ffffffffffffff30);
    ncnn::Mat::~Mat((Mat *)0x90463a);
    bVar1 = ncnn::Mat::empty(in_stack_ffffffffffffff30);
    if (bVar1) {
      local_4 = -100;
    }
    else {
      m = &local_b8;
      (**(code **)(*local_18 + 0x10))(m,local_18,*(undefined4 *)(in_RDI + 0xd4),1);
      ncnn::Mat::operator=(this_00,m);
      ncnn::Mat::~Mat((Mat *)0x9046cb);
      bVar1 = ncnn::Mat::empty(m);
      if (bVar1) {
        local_4 = -100;
      }
      else {
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

int GroupNorm::load_model(const ModelBin& mb)
{
    if (affine == 0)
        return 0;

    gamma_data = mb.load(channels, 1);
    if (gamma_data.empty())
        return -100;

    beta_data = mb.load(channels, 1);
    if (beta_data.empty())
        return -100;

    return 0;
}